

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qshortcut_widgets.cpp
# Opt level: O1

bool correctGraphicsWidgetContext(ShortcutContext context,QGraphicsWidget *w,QWidget *active_window)

{
  QWidget *this;
  bool bVar1;
  bool bVar2;
  WindowType WVar3;
  QGraphicsScene *pQVar4;
  QGraphicsScene *pQVar5;
  QGraphicsItem *pQVar6;
  QGraphicsItem *pQVar7;
  QWidget *pQVar8;
  QGraphicsWidget *pQVar9;
  QGraphicsWidget *pQVar10;
  long lVar11;
  long in_FS_OFFSET;
  QList<QGraphicsView_*> local_50;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (active_window != (QWidget *)0x0) {
    pQVar6 = &(w->super_QGraphicsObject).super_QGraphicsItem;
    bVar1 = QGraphicsItem::isVisible(pQVar6);
    if (((bVar1) && (bVar1 = QGraphicsItem::isEnabled(pQVar6), bVar1)) &&
       (pQVar4 = QGraphicsItem::scene(pQVar6), pQVar4 != (QGraphicsScene *)0x0)) {
      if (context == WidgetShortcut) {
        pQVar5 = (QGraphicsScene *)QGraphicsItem::scene(pQVar6);
        pQVar7 = QGraphicsScene::focusItem(pQVar5);
        bVar1 = pQVar6 == pQVar7;
        goto LAB_003a4ab4;
      }
      if (context != WidgetWithChildrenShortcut) {
        if (context == ApplicationShortcut) {
          pQVar5 = (QGraphicsScene *)QGraphicsItem::scene(pQVar6);
          QGraphicsScene::views(&local_50,pQVar5);
          bVar1 = local_50.d.size != 0;
          if ((bVar1) &&
             (bVar2 = QApplicationPrivate::tryModalHelper
                                ((QWidget *)*local_50.d.ptr,(QWidget **)0x0), !bVar2)) {
            lVar11 = 8;
            do {
              bVar2 = local_50.d.size << 3 == lVar11;
              bVar1 = !bVar2;
              if (bVar2) break;
              bVar2 = QApplicationPrivate::tryModalHelper
                                (*(QWidget **)((long)local_50.d.ptr + lVar11),(QWidget **)0x0);
              lVar11 = lVar11 + 8;
            } while (!bVar2);
          }
        }
        else {
          pQVar5 = (QGraphicsScene *)QGraphicsItem::scene(pQVar6);
          QGraphicsScene::views(&local_50,pQVar5);
          if (local_50.d.size != 0) {
            lVar11 = 0;
            do {
              this = *(QWidget **)((long)local_50.d.ptr + lVar11);
              pQVar8 = QWidget::window(this);
              if (pQVar8 == active_window) break;
              bVar1 = local_50.d.size * 8 + -8 != lVar11;
              lVar11 = lVar11 + 8;
              this = (QWidget *)0x0;
            } while (bVar1);
            if (this != (QWidget *)0x0) {
              pQVar5 = (QGraphicsScene *)QGraphicsItem::scene(pQVar6);
              pQVar9 = QGraphicsScene::activeWindow(pQVar5);
              pQVar10 = QGraphicsItem::window(pQVar6);
              if (pQVar10 == (QGraphicsWidget *)0x0) {
                bVar1 = true;
              }
              else {
                pQVar10 = QGraphicsItem::window(pQVar6);
                bVar1 = pQVar9 == pQVar10;
              }
              goto LAB_003a4b87;
            }
          }
          bVar1 = false;
        }
LAB_003a4b87:
        if (&(local_50.d.d)->super_QArrayData != (QArrayData *)0x0) {
          LOCK();
          ((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               ((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if (((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(&(local_50.d.d)->super_QArrayData,8,0x10);
          }
        }
        goto LAB_003a4ab4;
      }
      pQVar5 = (QGraphicsScene *)QGraphicsItem::scene(pQVar6);
      pQVar6 = QGraphicsScene::focusItem(pQVar5);
      if ((pQVar6 != (QGraphicsItem *)0x0) && (bVar1 = QGraphicsItem::isWidget(pQVar6), bVar1)) {
        pQVar9 = (QGraphicsWidget *)(pQVar6 + -1);
        bVar1 = pQVar9 == w;
        if (!bVar1) {
          while ((WVar3 = QGraphicsWidget::windowType((QGraphicsWidget *)pQVar9), WVar3 == Widget ||
                 (WVar3 = QGraphicsWidget::windowType((QGraphicsWidget *)pQVar9), WVar3 == Popup)))
          {
            pQVar9 = QGraphicsItem::parentWidget
                               (&(pQVar9->super_QGraphicsObject).super_QGraphicsItem);
            bVar1 = pQVar9 == w;
            if ((pQVar9 == (QGraphicsWidget *)0x0) || (pQVar9 == w)) break;
          }
        }
        goto LAB_003a4ab4;
      }
    }
  }
  bVar1 = false;
LAB_003a4ab4:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return bVar1;
  }
  __stack_chk_fail();
}

Assistant:

static bool correctGraphicsWidgetContext(Qt::ShortcutContext context, QGraphicsWidget *w, QWidget *active_window)
{
    if (!active_window)
        return false;

    bool visible = w->isVisible();
#if defined(Q_OS_DARWIN) && QT_CONFIG(menubar)
    if (!QCoreApplication::testAttribute(Qt::AA_DontUseNativeMenuBar) && qobject_cast<QMenuBar *>(w))
        visible = true;
#endif

    if (!visible || !w->isEnabled() || !w->scene())
        return false;

    if (context == Qt::ApplicationShortcut) {
        // Applicationwide shortcuts are always reachable unless their owner
        // is shadowed by modality. In QGV there's no modality concept, but we
        // must still check if all views are shadowed.
        const auto &views = w->scene()->views();
        for (auto view : views) {
            if (QApplicationPrivate::tryModalHelper(view, nullptr))
                return true;
        }
        return false;
    }

    if (context == Qt::WidgetShortcut)
        return static_cast<QGraphicsItem *>(w) == w->scene()->focusItem();

    if (context == Qt::WidgetWithChildrenShortcut) {
        const QGraphicsItem *ti = w->scene()->focusItem();
        if (ti && ti->isWidget()) {
            const auto *tw = static_cast<const QGraphicsWidget *>(ti);
            while (tw && tw != w && (tw->windowType() == Qt::Widget || tw->windowType() == Qt::Popup))
                tw = tw->parentWidget();
            return tw == w;
        }
        return false;
    }

    // Below is Qt::WindowShortcut context

    // Find the active view (if any).
    const auto &views = w->scene()->views();
    QGraphicsView *activeView = nullptr;
    for (auto view : views) {
        if (view->window() == active_window) {
            activeView = view;
            break;
        }
    }
    if (!activeView)
        return false;

    // The shortcut is reachable if owned by a windowless widget, or if the
    // widget's window is the same as the focus item's window.
    QGraphicsWidget *a = w->scene()->activeWindow();
    return !w->window() || a == w->window();
}